

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CutoffGroup.hpp
# Opt level: O2

void __thiscall OpenMD::CutoffGroup::updateCOM(CutoffGroup *this)

{
  double dVar1;
  uint uVar2;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int __denom;
  int __denom_00;
  DataStorage *this_00;
  pointer ppAVar3;
  int __numer;
  undefined1 *puVar4;
  Atom *this_01;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  this_00 = (DataStorage *)
            ((long)&(this->snapshotMan_->currentSnapshot_->atomData).position.
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + this->storage_);
  uVar2 = DataStorage::getStorageLayout(this_00);
  ppAVar3 = (this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((long)(this->cutoffAtomList).
            super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppAVar3 == 8) {
    StuntDouble::getPos((Vector3d *)&local_60,&(*ppAVar3)->super_StuntDouble);
    Vector<double,_3U>::operator=
              (&(this_00->position).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                super_Vector<double,_3U>,&local_60);
    if ((uVar2 & 2) != 0) {
      StuntDouble::getVel((Vector3d *)&local_60,
                          &(*(this->cutoffAtomList).
                             super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                             _M_impl.super__Vector_impl_data._M_start)->super_StuntDouble);
      Vector<double,_3U>::operator=
                (&(this_00->velocity).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                  super_Vector<double,_3U>,&local_60);
    }
  }
  else {
    getMass(this);
    puVar4 = OpenMD::V3Zero;
    Vector<double,_3U>::operator=
              (&(this_00->position).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
    __denom = extraout_EDX;
    if ((uVar2 & 2) != 0) {
      puVar4 = OpenMD::V3Zero;
      Vector<double,_3U>::operator=
                (&(this_00->velocity).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                  super_Vector<double,_3U>,(Vector<double,_3U> *)OpenMD::V3Zero);
      __denom = extraout_EDX_00;
    }
    ppAVar3 = (this->cutoffAtomList).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppAVar3 ==
        (this->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      this_01 = (Atom *)0x0;
    }
    else {
      this_01 = *ppAVar3;
    }
    while( true ) {
      __numer = (int)puVar4;
      ppAVar3 = ppAVar3 + 1;
      if (this_01 == (Atom *)0x0) break;
      dVar1 = (this_01->super_StuntDouble).mass_;
      StuntDouble::getPos((Vector3d *)&local_48,&this_01->super_StuntDouble);
      operator*(&local_60,dVar1,&local_48);
      puVar4 = (undefined1 *)&local_60;
      Vector<double,_3U>::add
                (&(this_00->position).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                  super_Vector<double,_3U>,&local_60);
      __denom = extraout_EDX_01;
      if ((uVar2 & 2) != 0) {
        dVar1 = (this_01->super_StuntDouble).mass_;
        StuntDouble::getVel((Vector3d *)&local_48,&this_01->super_StuntDouble);
        operator*(&local_60,dVar1,&local_48);
        puVar4 = (undefined1 *)&local_60;
        Vector<double,_3U>::add
                  (&(this_00->velocity).
                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                    super_Vector<double,_3U>,&local_60);
        __denom = extraout_EDX_02;
      }
      if (ppAVar3 ==
          (this->cutoffAtomList).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        this_01 = (Atom *)0x0;
      }
      else {
        this_01 = *ppAVar3;
      }
    }
    Vector<double,_3U>::div
              (&(this_00->position).
                super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                super_Vector<double,_3U>,__numer,__denom);
    if ((uVar2 & 2) != 0) {
      Vector<double,_3U>::div
                (&(this_00->velocity).
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[this->localIndex_].
                  super_Vector<double,_3U>,__numer,__denom_00);
    }
  }
  return;
}

Assistant:

void updateCOM() {
      DataStorage& data = snapshotMan_->getCurrentSnapshot()->*storage_;
      bool needsVel     = false;
      if (data.getStorageLayout() & DataStorage::dslVelocity) needsVel = true;

      if (cutoffAtomList.size() == 1) {
        data.position[localIndex_] = cutoffAtomList[0]->getPos();
        if (needsVel) data.velocity[localIndex_] = cutoffAtomList[0]->getVel();
      } else {
        std::vector<Atom*>::iterator i;
        Atom* atom;
        RealType totalMass         = getMass();
        data.position[localIndex_] = V3Zero;
        if (needsVel) data.velocity[localIndex_] = V3Zero;

        for (atom = beginAtom(i); atom != NULL; atom = nextAtom(i)) {
          data.position[localIndex_] += atom->getMass() * atom->getPos();
          if (needsVel)
            data.velocity[localIndex_] += atom->getMass() * atom->getVel();
        }
        data.position[localIndex_] /= totalMass;
        if (needsVel) data.velocity[localIndex_] /= totalMass;
      }
    }